

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb2Core.c
# Opt level: O0

void Llb_CoreStop(Llb_Img_t *p)

{
  int iVar1;
  DdManager *table;
  DdNode *n;
  int local_24;
  int i;
  DdNode *bTemp;
  DdManager *dd;
  Llb_Img_t *p_local;
  
  if (p->vDdMans != (Vec_Ptr_t *)0x0) {
    for (local_24 = 0; iVar1 = Vec_PtrSize(p->vDdMans), local_24 < iVar1; local_24 = local_24 + 1) {
      table = (DdManager *)Vec_PtrEntry(p->vDdMans,local_24);
      if (table->bFunc != (DdNode *)0x0) {
        Cudd_RecursiveDeref(table,table->bFunc);
      }
      if (table->bFunc2 != (DdNode *)0x0) {
        Cudd_RecursiveDeref(table,table->bFunc2);
      }
      Extra_StopManager(table);
    }
  }
  Vec_PtrFreeP(&p->vDdMans);
  if (p->ddR->bFunc != (DdNode *)0x0) {
    Cudd_RecursiveDeref(p->ddR,p->ddR->bFunc);
  }
  for (local_24 = 0; iVar1 = Vec_PtrSize(p->vRings), local_24 < iVar1; local_24 = local_24 + 1) {
    n = (DdNode *)Vec_PtrEntry(p->vRings,local_24);
    Cudd_RecursiveDeref(p->ddR,n);
  }
  Vec_PtrFree(p->vRings);
  Extra_StopManager(p->dd);
  Extra_StopManager(p->ddG);
  Extra_StopManager(p->ddR);
  Vec_IntFreeP(&p->vDriRefs);
  Vec_IntFreeP(&p->vVarsCs);
  Vec_IntFreeP(&p->vVarsNs);
  Vec_IntFreeP(&p->vCs2Glo);
  Vec_IntFreeP(&p->vNs2Glo);
  Vec_IntFreeP(&p->vGlo2Cs);
  Vec_IntFreeP(&p->vGlo2Ns);
  if (p != (Llb_Img_t *)0x0) {
    free(p);
  }
  return;
}

Assistant:

void Llb_CoreStop( Llb_Img_t * p )
{
    DdManager * dd;
    DdNode * bTemp;
    int i;
    if ( p->vDdMans )
    Vec_PtrForEachEntry( DdManager *, p->vDdMans, dd, i )
    {
        if ( dd->bFunc )
            Cudd_RecursiveDeref( dd, dd->bFunc );
        if ( dd->bFunc2 )
            Cudd_RecursiveDeref( dd, dd->bFunc2 );
        Extra_StopManager( dd );
    }
    Vec_PtrFreeP( &p->vDdMans );
    if ( p->ddR->bFunc )
        Cudd_RecursiveDeref( p->ddR, p->ddR->bFunc );
    Vec_PtrForEachEntry( DdNode *, p->vRings, bTemp, i )
        Cudd_RecursiveDeref( p->ddR, bTemp );
    Vec_PtrFree( p->vRings );
    Extra_StopManager( p->dd );
    Extra_StopManager( p->ddG );
    Extra_StopManager( p->ddR );
    Vec_IntFreeP( &p->vDriRefs );
    Vec_IntFreeP( &p->vVarsCs );
    Vec_IntFreeP( &p->vVarsNs );
    Vec_IntFreeP( &p->vCs2Glo );
    Vec_IntFreeP( &p->vNs2Glo );
    Vec_IntFreeP( &p->vGlo2Cs );
    Vec_IntFreeP( &p->vGlo2Ns );
    ABC_FREE( p );
}